

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  span<char> sVar1;
  
  (this->super_buffer<char>).size_ = 0;
  (this->super_buffer<char>).capacity_ = 0;
  (this->super_buffer<char>).grow_ = grow;
  (this->file_).super_file_base<_IO_FILE>.file_ = f;
  flockfile((FILE *)f);
  glibc_file<_IO_FILE>::init_buffer(&this->file_);
  sVar1 = glibc_file<_IO_FILE>::get_write_buffer(&this->file_);
  (this->super_buffer<char>).ptr_ = sVar1.data;
  (this->super_buffer<char>).capacity_ = sVar1.size;
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }